

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void aam_(PDISASM pMyDisasm)

{
  int iVar1;
  UIntPtr UVar2;
  ulong uVar3;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
    return;
  }
  if (pMyDisasm->Archi == 0x40) {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Instruction).Category = 0x10002;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"aam",4);
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  (pMyDisasm->Operand1).OpSize = 0x10;
  (pMyDisasm->Reserved_).ImmediatSize = 8;
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    UVar2 = (pMyDisasm->Reserved_).EIP_;
    uVar3 = (ulong)*(byte *)(UVar2 + 1);
    if (uVar3 != 10) {
      (pMyDisasm->Instruction).Immediat = uVar3;
      if (uVar3 == 0) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 3;
      }
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.2X",
                          (ulong)*(byte *)(UVar2 + 1));
      (pMyDisasm->Operand2).OpType = 0x8040000;
      (pMyDisasm->Operand2).OpSize = 8;
      UVar2 = (pMyDisasm->Reserved_).EIP_;
    }
    (pMyDisasm->Reserved_).EIP_ = UVar2 + 2;
  }
  return;
}

Assistant:

void __bea_callspec__ aam_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  if (pMyDisasm->Archi == 64) GV.ERROR_OPCODE = UD_;

  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "aam");
  #endif
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
  pMyDisasm->Operand1.OpSize = 16;
  GV.ImmediatSize = 8;
  if (!Security(2, pMyDisasm)) return;
  if (*((UInt8*) (GV.EIP_+1)) != 0x0A) {
    pMyDisasm->Instruction.Immediat = *((UInt8*) (GV.EIP_+1));
    if (pMyDisasm->Instruction.Immediat == 0) GV.ERROR_OPCODE = DE__;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.2X",(Int64) *((UInt8*) (GV.EIP_+1)));
    #endif
    pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
    pMyDisasm->Operand2.OpSize = 8;
  }
  GV.EIP_+=2;
}